

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.hpp
# Opt level: O1

vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> *
Optimizer::generateSubstitutions
          (vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
           *__return_storage_ptr__,ScheduleHandle *schedule)

{
  element_type *peVar1;
  pointer pOVar2;
  pointer pOVar3;
  ScheduleHandle new_schedule;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  Schedule::analyze((schedule->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar1 = (schedule->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pOVar2 = (peVar1->occupies).super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pOVar3 = (peVar1->occupies).super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                super__Vector_impl_data._M_start; pOVar3 != pOVar2; pOVar3 = pOVar3 + 1) {
    Schedule::apply((Schedule *)&stack0xffffffffffffffc8,
                    (Occupy *)
                    (schedule->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>::push_back
              (__return_storage_ptr__,(value_type *)&stack0xffffffffffffffc8);
    Schedule::analyze((Schedule *)local_38);
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<ScheduleHandle> generateSubstitutions(const ScheduleHandle &schedule) {
        // Analyze schedule
        schedule->analyze();

        // Re-generate graph
        // printf(" @ Generating substitutions (count: %zu, peak: %s, time: %s) ...\n", schedule->occupies.size(),
        //        prettyBytes(schedule->peak_memory).c_str(), prettyNanoseconds(schedule->total_time).c_str());
        std::vector<ScheduleHandle> substitutions;
        for (auto &occupy: schedule->occupies) {
            // printf("   @ [%s, %s] occupies (score1=%.6lf, score2=%.6lf)\n", occupy.gen->name.c_str(),
            //        occupy.use->name.c_str(), occupy.score1, occupy.score2);
            // printf("   @ Moving: %d\n", occupy.move);
            // for (auto &usage: occupy.gen->ins) {
            //     printf("     @ In: %d\n", usage.operand->id);
            // }
            // for (auto &usage: occupy.gen->outs) {
            //     printf("     @ Out: %d\n", usage.operand->id);
            // }
            // for (auto &task: occupy.re_gen) {
            //     printf("     @ Re-gen: %s\n", task->name.c_str());
            // }
            auto new_schedule = schedule->apply(occupy);
            substitutions.push_back(new_schedule);
            new_schedule->analyze();
            // printf("   @ Optimized to (peak: %s, memory: %s, s1: %.3lf, s2: %.3lf)\n", prettyBytes(new_schedule->peak_memory).c_str(),
            //        prettyNanoseconds(new_schedule->total_time).c_str(), occupy.score1, occupy.score2);
        }
        return substitutions;
    }